

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error cdataSectionProcessor(XML_Parser parser,char *start,char *end,char **endPtr)

{
  XML_Error result;
  char **endPtr_local;
  char *end_local;
  char *start_local;
  XML_Parser parser_local;
  
  end_local = start;
  start_local = (char *)parser;
  parser_local._4_4_ =
       doCdataSection(parser,parser->m_encoding,&end_local,end,endPtr,
                      ((parser->m_parsingStatus).finalBuffer != '\0' ^ 0xffU) & 1,XML_ACCOUNT_DIRECT
                     );
  if ((parser_local._4_4_ == XML_ERROR_NONE) && (end_local != (char *)0x0)) {
    if (*(long *)(start_local + 0x368) == 0) {
      *(code **)(start_local + 0x1f8) = contentProcessor;
      parser_local._4_4_ = contentProcessor((XML_Parser)start_local,end_local,end,endPtr);
    }
    else {
      *(code **)(start_local + 0x1f8) = externalEntityContentProcessor;
      parser_local._4_4_ =
           externalEntityContentProcessor((XML_Parser)start_local,end_local,end,endPtr);
    }
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error PTRCALL
cdataSectionProcessor(XML_Parser parser, const char *start, const char *end,
                      const char **endPtr) {
  enum XML_Error result = doCdataSection(
      parser, parser->m_encoding, &start, end, endPtr,
      (XML_Bool)! parser->m_parsingStatus.finalBuffer, XML_ACCOUNT_DIRECT);
  if (result != XML_ERROR_NONE)
    return result;
  if (start) {
    if (parser->m_parentParser) { /* we are parsing an external entity */
      parser->m_processor = externalEntityContentProcessor;
      return externalEntityContentProcessor(parser, start, end, endPtr);
    } else {
      parser->m_processor = contentProcessor;
      return contentProcessor(parser, start, end, endPtr);
    }
  }
  return result;
}